

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

uint16_t addip_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  ushort uVar1;
  uint uVar2;
  size_t ib;
  size_t ia;
  bool bVar3;
  
  uVar2 = 0;
  while( true ) {
    bVar3 = nb == 0;
    nb = nb - 1;
    if (bVar3) {
      while( true ) {
        bVar3 = na == 0;
        na = na - 1;
        if ((bVar3) || ((uint16_t)uVar2 == 0)) break;
        uVar1 = a[na];
        a[na] = (uint16_t)(uVar1 + 1);
        uVar2 = uVar1 + 1 >> 0x10;
      }
      return (uint16_t)uVar2;
    }
    bVar3 = na == 0;
    na = na - 1;
    if (bVar3) break;
    uVar2 = uVar2 + a[na] + (uint)b[nb];
    a[na] = (uint16_t)uVar2;
    uVar2 = uVar2 >> 0x10;
  }
  __assert_fail("ia",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                ,0x486,"uint16_t addip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
}

Assistant:

static uint16_t addip_u16n(uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	const uint32_t mask = ((uint32_t)1 << 16) - 1;
	uint16_t carry = 0;
	size_t ia = na, ib = nb;

	while (ib > 0) {
		uint32_t t;

		assert(ia);
		--ia;
		--ib;
		t = (uint32_t)a[ia] + (uint32_t)b[ib] + (uint32_t)carry;
		a[ia] = t & mask;
		carry = (uint16_t)(t >> 16);
	}
	while (ia > 0 && carry) {
		uint32_t t;

		--ia;
		t = (uint32_t)a[ia] + (uint32_t)carry;
		a[ia] = t & mask;
		carry = (uint16_t)(t >> 16);
	}
	return carry;
}